

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * readerStrdup(xmlTextReaderPtr reader,xmlChar *string)

{
  xmlChar *copy;
  xmlChar *string_local;
  xmlTextReaderPtr reader_local;
  
  if (string == (xmlChar *)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    reader_local = (xmlTextReaderPtr)xmlStrdup(string);
    if (reader_local == (xmlTextReaderPtr)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

static xmlChar *
readerStrdup(xmlTextReaderPtr reader, const xmlChar *string) {
    xmlChar *copy;

    if (string == NULL)
        return(NULL);

    copy = xmlStrdup(string);
    if (copy == NULL)
        xmlTextReaderErrMemory(reader);

    return(copy);
}